

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatementReader.cpp
# Opt level: O0

void __thiscall
Js::
StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
::Create(StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
         *this,FunctionBody *functionRead,uint startOffset,bool useOriginalByteCode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SmallSpanSequence *statementMap_00;
  byte *byteCodeStart;
  ByteBlock *local_48;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_38;
  StatementMapList *fullMap;
  SmallSpanSequence *statementMap;
  ByteBlock *pblkByteCode;
  bool useOriginalByteCode_local;
  uint startOffset_local;
  FunctionBody *functionRead_local;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  *this_local;
  
  if (functionRead == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/StatementReader.cpp"
                                ,0x57,"(functionRead != nullptr)",
                                "Must provide valid function to execute");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (useOriginalByteCode) {
    local_48 = FunctionBody::GetOriginalByteCode(functionRead);
  }
  else {
    local_48 = FunctionBody::GetByteCode(functionRead);
  }
  if (local_48 == (ByteBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/StatementReader.cpp"
                                ,0x5d,"(pblkByteCode != nullptr)",
                                "Must have valid byte-code to read");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  statementMap_00 = FunctionBody::GetStatementMapSpanSequence(functionRead);
  local_38 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)0x0;
  if ((statementMap_00 == (SmallSpanSequence *)0x0) &&
     (bVar2 = FunctionProxy::IsInDebugMode((FunctionProxy *)functionRead), bVar2)) {
    local_38 = FunctionBody::GetStatementMaps(functionRead);
  }
  byteCodeStart = ByteBlock::GetBuffer(local_48);
  Create(this,byteCodeStart,startOffset,statementMap_00,local_38);
  return;
}

Assistant:

void StatementReader<FunctionBody::StatementMapList>::Create(FunctionBody* functionRead, uint startOffset, bool useOriginalByteCode)
    {
        AssertMsg(functionRead != nullptr, "Must provide valid function to execute");

        ByteBlock * pblkByteCode = useOriginalByteCode ?
            functionRead->GetOriginalByteCode() :
            functionRead->GetByteCode();

        AssertMsg(pblkByteCode != nullptr, "Must have valid byte-code to read");

        SmallSpanSequence* statementMap = functionRead->GetStatementMapSpanSequence();
        FunctionBody::StatementMapList* fullMap = nullptr;
        if (statementMap == nullptr && functionRead->IsInDebugMode())
        {
            fullMap = functionRead->GetStatementMaps();
        }
        Create(pblkByteCode->GetBuffer(), startOffset, statementMap, fullMap);
    }